

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void ReadArray<aiVector3t<float>>(IOStream *stream,aiVector3t<float> *out,uint size)

{
  aiVector3t<float> *paVar1;
  aiVector3D aVar2;
  undefined8 local_40;
  float local_38;
  uint local_20;
  uint i;
  uint size_local;
  aiVector3t<float> *out_local;
  IOStream *stream_local;
  
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assbin/AssbinLoader.cpp"
                  ,0xc6,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVector3t<float>]");
  }
  if (out != (aiVector3t<float> *)0x0) {
    for (local_20 = 0; local_20 < size; local_20 = local_20 + 1) {
      aVar2 = Read<aiVector3t<float>>(stream);
      local_40 = aVar2._0_8_;
      local_38 = aVar2.z;
      paVar1 = out + local_20;
      paVar1->x = (float)(undefined4)local_40;
      paVar1->y = (float)local_40._4_4_;
      paVar1->z = local_38;
    }
    return;
  }
  __assert_fail("nullptr != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assbin/AssbinLoader.cpp"
                ,199,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVector3t<float>]");
}

Assistant:

void ReadArray( IOStream *stream, T * out, unsigned int size) {
    ai_assert( nullptr != stream );
    ai_assert( nullptr != out );

    for (unsigned int i=0; i<size; i++) {
        out[i] = Read<T>(stream);
    }
}